

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,uint n_row,uint n_col)

{
  bool bVar1;
  reference this_00;
  EVP_PKEY_CTX *ctx;
  vector<double,_std::allocator<double>_> *vec;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  uint n_col_local;
  uint n_row_local;
  Matrix<double> *this_local;
  
  (this->m_shape).n_row = 0;
  (this->m_shape).n_col = 0;
  (this->m_shape).is_diogonal = false;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->m_elems);
  (this->m_shape).is_diogonal = false;
  (this->m_shape).n_row = n_row;
  (this->m_shape).n_col = n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->m_elems,(ulong)n_row);
  __end0 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(&this->m_elems);
  vec = (vector<double,_std::allocator<double>_> *)
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end(&this->m_elems);
  while( true ) {
    ctx = (EVP_PKEY_CTX *)&vec;
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)ctx);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
              ::operator*(&__end0);
    std::vector<double,_std::allocator<double>_>::resize(this_00,(ulong)n_col);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end0);
  }
  init(this,ctx);
  return;
}

Assistant:

Matrix<T>::Matrix(unsigned n_row, unsigned n_col){
    m_shape={n_row, n_col};

    m_elems.resize(n_row);
    for(auto& vec: m_elems)
        vec.resize(n_col);
    init();
}